

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

t_gotfn getfn(t_pd *x,t_symbol *s)

{
  t_pd p_Var1;
  t_gotfn *pp_Var2;
  int iVar3;
  bool bVar4;
  
  p_Var1 = *x;
  iVar3 = p_Var1->c_nmethod;
  pp_Var2 = &p_Var1->c_methods->me_fun;
  while( true ) {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      pd_error(x,"%s: no method for message \'%s\'",p_Var1->c_name->s_name,s->s_name);
      return nullfn;
    }
    if (((t_methodentry *)(pp_Var2 + -1))->me_name == s) break;
    pp_Var2 = pp_Var2 + 3;
  }
  return *pp_Var2;
}

Assistant:

t_gotfn getfn(const t_pd *x, t_symbol *s)
{
    const t_class *c = *x;
    t_methodentry *m, *mlist;
    int i;

#ifdef PDINSTANCE
    mlist = c->c_methods[pd_this->pd_instanceno];
#else
    mlist = c->c_methods;
#endif
    for (i = c->c_nmethod, m = mlist; i--; m++)
        if (m->me_name == s) return(m->me_fun);
    pd_error(x, "%s: no method for message '%s'", c->c_name->s_name, s->s_name);
    return((t_gotfn)nullfn);
}